

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t bsc_sync(bsc_step_t until)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  void *pvVar9;
  bsp_pid_t bVar10;
  uint uVar11;
  bsp_pid_t bVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 *puVar16;
  bsc_step_t bVar17;
  double dVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  void *pvVar24;
  size_t __nmemb;
  double dVar25;
  uint local_64;
  uint local_60;
  uint local_5c;
  double local_58;
  void *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_60 = bsp_nprocs();
  uVar23 = (ulong)local_60;
  uVar14 = uVar23;
  uVar11 = bsc_s_bsc;
  local_5c = until;
  local_48 = uVar23;
  bVar17 = until;
  if (DAT_001203b0 == (void *)0x0) {
    bVar10 = bsp_nprocs();
    pvVar13 = calloc((long)bVar10,4);
    DAT_001203b0 = pvVar13;
    bVar10 = bsp_nprocs();
    bsp_push_reg(pvVar13,bVar10 * 4);
    bsp_sync();
    uVar11 = bsc_s_bsc;
    bVar17 = until;
  }
  do {
    local_64 = bVar17;
    bsc_s_bsc = uVar11;
    pvVar13 = DAT_001203b0;
    if ((local_64 != 0xffffffff) && (local_64 <= bsc_s_bsc)) {
      return bsc_s_bsc;
    }
    for (uVar15 = 0; uVar23 != uVar15; uVar15 = uVar15 + 1) {
      *(undefined4 *)((long)pvVar13 + uVar15 * 4) = 0xffffffff;
    }
    bVar17 = local_64;
    if (DAT_0012038c != 0) {
      uVar23 = (ulong)DAT_00120394;
      lVar20 = 0x50;
      for (dVar18 = 0.0; (ulong)dVar18 < (ulong)*(uint *)(DAT_00120398 + uVar23 * 4);
          dVar18 = (double)((long)dVar18 + 1)) {
        lVar21 = (ulong)(uint)(DAT_00120390 * (int)uVar23) * 0x58 + DAT_001203a0;
        if (*(int *)(lVar20 + -0x50 + lVar21) == 3) {
          if (DAT_001203bc == 0) {
            hash_table_create((hash_table_t *)&DAT_001203b8,1000,collcoa_is_equal,collcoa_hash);
          }
          uVar11 = DAT_00120424;
          if (DAT_00120424 == DAT_00120420) {
            uVar3 = DAT_00120424 * 2;
            if ((int)DAT_00120424 < 0x1f5) {
              uVar3 = 1000;
            }
            local_58 = dVar18;
            pvVar13 = calloc((ulong)uVar3,8);
            local_50 = calloc((ulong)uVar3,0x18);
            if (pvVar13 == (void *)0x0 || local_50 == (void *)0x0) {
              bsp_abort("bsc_sync: insufficient memory\n");
              uVar11 = DAT_00120424;
            }
            pvVar24 = DAT_00120418;
            memcpy(pvVar13,DAT_00120418,(long)(int)uVar11 * 8);
            pvVar9 = local_50;
            memcpy(local_50,DAT_00120430,(long)(int)uVar11 * 0x18);
            free(pvVar24);
            free(DAT_00120430);
            DAT_00120430 = pvVar9;
            dVar18 = local_58;
            DAT_00120418 = pvVar13;
            DAT_00120420 = uVar3;
          }
          pvVar24 = (void *)(lVar20 + lVar21 + -0x48);
          pvVar13 = hash_table_new_item((hash_table_t *)&DAT_001203b8,pvVar24);
          uVar23 = (ulong)DAT_00120394;
          if (pvVar24 == pvVar13) {
            lVar21 = (long)(int)DAT_00120424;
            if ((int)DAT_00120420 <= (int)DAT_00120424) {
              __assert_fail("sbsc->collcoa_set_size < sbsc->collcoa_set_reserved",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                            ,0x112,"void expand_coll(coll_request_t *)");
            }
            DAT_00120424 = DAT_00120424 + 1;
            *(void **)((long)DAT_00120418 + lVar21 * 8) = pvVar13;
          }
          else {
            *(undefined8 *)(lVar21 + lVar20) = *(undefined8 *)((long)pvVar13 + 0x48);
            *(void **)((long)pvVar13 + 0x48) = pvVar24;
          }
        }
        lVar20 = lVar20 + 0x58;
      }
      pvVar13 = (void *)0x0;
      uVar23 = 0;
LAB_00112fdf:
      pvVar24 = DAT_00120430;
      uVar14 = (ulong)(int)DAT_00120424;
      if ((long)pvVar13 < (long)uVar14) {
        puVar16 = *(undefined8 **)((long)DAT_00120418 + (long)pvVar13 * 8);
        local_40 = (long)pvVar13 * 0x18;
        *(undefined8 *)((long)DAT_00120430 + local_40) = *puVar16;
        *(undefined8 *)((long)pvVar24 + local_40 + 8) = puVar16[2];
        *(undefined4 *)((long)pvVar24 + local_40 + 0x10) = *(undefined4 *)(puVar16 + 1);
        uVar11 = 0;
        local_50 = pvVar13;
        local_38 = uVar23;
        do {
          local_58 = (double)(ulong)uVar11;
          uVar11 = (int)local_38 + uVar11;
          uVar23 = (ulong)uVar11;
          while( true ) {
            iVar22 = DAT_00120438;
            pvVar13 = DAT_00120428;
            if (puVar16 == (undefined8 *)0x0) {
              *(int *)((long)DAT_00120430 + local_40 + 0x14) = SUB84(local_58,0);
              pvVar13 = (void *)((long)local_50 + 1);
              goto LAB_00112fdf;
            }
            if ((int)uVar11 < DAT_00120438) break;
            __nmemb = (size_t)(uint)(DAT_00120438 * 2);
            if (DAT_00120438 < 0x33) {
              __nmemb = 100;
            }
            pvVar13 = calloc(__nmemb,0x30);
            if (pvVar13 == (void *)0x0) {
              bsp_abort("bsc_sync: insufficient memory\n");
              iVar22 = DAT_00120438;
            }
            pvVar24 = DAT_00120428;
            memcpy(pvVar13,DAT_00120428,(long)iVar22 * 0x30);
            free(pvVar24);
            DAT_00120438 = (int)__nmemb;
            DAT_00120428 = pvVar13;
          }
          lVar20 = uVar23 * 0x30;
          uVar4 = puVar16[3];
          uVar5 = puVar16[4];
          uVar6 = puVar16[5];
          uVar7 = puVar16[6];
          uVar8 = puVar16[8];
          puVar1 = (undefined8 *)((long)DAT_00120428 + lVar20 + 0x20);
          *puVar1 = puVar16[7];
          puVar1[1] = uVar8;
          puVar1 = (undefined8 *)((long)pvVar13 + lVar20 + 0x10);
          *puVar1 = uVar6;
          puVar1[1] = uVar7;
          puVar1 = (undefined8 *)((long)pvVar13 + lVar20);
          *puVar1 = uVar4;
          puVar1[1] = uVar5;
          puVar16 = (undefined8 *)puVar16[9];
          uVar11 = SUB84(local_58,0) + 1;
        } while( true );
      }
      iVar22 = 0;
      pvVar13 = (void *)0x0;
      while ((long)pvVar13 < (long)(int)uVar14) {
        lVar21 = (long)pvVar13 * 0x18;
        lVar20 = *(long *)((long)DAT_00120430 + lVar21);
        uVar4 = *(undefined8 *)((long)DAT_00120430 + lVar21 + 8);
        local_40 = CONCAT44(local_40._4_4_,*(undefined4 *)((long)DAT_00120430 + lVar21 + 0x10));
        iVar2 = *(int *)((long)DAT_00120430 + lVar21 + 0x14);
        dVar18 = INFINITY;
        uVar23 = 0;
        local_50 = pvVar13;
        for (uVar14 = 0; (long)uVar14 < (long)*(int *)(lVar20 + 0xf0); uVar14 = uVar14 + 1) {
          local_58 = dVar18;
          dVar25 = (double)(**(code **)(lVar20 + 0x50 + uVar14 * 8))
                                     (uVar4,(void *)((long)iVar22 * 0x30 + (long)DAT_00120428),iVar2
                                     );
          dVar18 = local_58;
          if (dVar25 < local_58) {
            uVar23 = uVar14 & 0xffffffff;
            dVar18 = dVar25;
          }
        }
        (**(code **)(lVar20 + (long)(int)uVar23 * 8))
                  (bsc_s_bsc,local_40 & 0xffffffff,uVar4,
                   (void *)((long)iVar22 * 0x30 + (long)DAT_00120428),iVar2);
        iVar22 = iVar22 + iVar2;
        uVar14 = (ulong)DAT_00120424;
        pvVar13 = (void *)((long)local_50 + 1);
      }
      hash_table_clear((hash_table_t *)&DAT_001203b8);
      DAT_00120424 = 0;
      lVar20 = 0x18;
      for (uVar23 = 0; uVar11 = *(uint *)(DAT_00120398 + (ulong)DAT_00120394 * 4), uVar23 < uVar11;
          uVar23 = uVar23 + 1) {
        lVar21 = (ulong)(DAT_00120390 * DAT_00120394) * 0x58 + DAT_001203a0;
        iVar22 = *(int *)(lVar20 + -0x18 + lVar21);
        if (iVar22 == 1) {
          iVar22 = *(int *)(lVar21 + 4 + lVar20);
          bVar10 = bsp_pid();
          if (iVar22 != bVar10) {
            __assert_fail("r->payload.get.dst_pid == bsp_pid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                          ,0x233,"bsc_step_t bsc_sync(bsc_step_t)");
          }
          bsp_get(*(bsp_pid_t *)(lVar21 + lVar20),*(void **)(lVar21 + -0x10 + lVar20),
                  *(bsp_size_t *)(lVar21 + 0xc + lVar20),*(void **)(lVar21 + -8 + lVar20),
                  *(bsp_size_t *)(lVar21 + 8 + lVar20));
        }
        else if (iVar22 == 0) {
          iVar22 = *(int *)(lVar21 + lVar20);
          bVar10 = bsp_pid();
          if (iVar22 != bVar10) {
            __assert_fail("r->payload.put.src_pid == bsp_pid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                          ,0x22e,"bsc_step_t bsc_sync(bsc_step_t)");
          }
          bsp_put(*(bsp_pid_t *)(lVar21 + 4 + lVar20),*(void **)(lVar21 + -0x10 + lVar20),
                  *(void **)(lVar21 + -8 + lVar20),*(bsp_size_t *)(lVar21 + 0xc + lVar20),
                  *(bsp_size_t *)(lVar21 + 8 + lVar20));
        }
        lVar20 = lVar20 + 0x58;
      }
      DAT_001203a8 = DAT_001203a8 - uVar11;
      uVar23 = local_48;
      bVar17 = local_5c;
      if (DAT_001203a8 == 0) {
        local_64 = local_5c;
        uVar14 = (ulong)local_60;
      }
      else {
        local_64 = 1;
        uVar14 = (ulong)local_60;
        while ((local_64 < DAT_0012038c &&
               (*(int *)(DAT_00120398 + ((ulong)(DAT_00120394 + local_64) % (ulong)DAT_0012038c) * 4
                        ) == 0))) {
          local_64 = local_64 + 1;
        }
        local_64 = local_64 + bsc_s_bsc;
      }
    }
    if (local_64 != 0xffffffff) {
      for (bVar10 = 0; pvVar13 = DAT_001203b0, (int)uVar14 != bVar10; bVar10 = bVar10 + 1) {
        bVar12 = bsp_pid();
        bsp_put(bVar10,&local_64,pvVar13,bVar12 * 4,4);
      }
    }
    bsp_sync();
    uVar11 = bVar17;
    local_64 = bVar17;
    for (uVar15 = 0; uVar23 != uVar15; uVar15 = uVar15 + 1) {
      uVar3 = *(uint *)((long)DAT_001203b0 + uVar15 * 4);
      if (uVar3 < uVar11) {
        uVar11 = uVar3;
        local_64 = uVar3;
      }
    }
    if (DAT_0012038c != 0) {
      lVar20 = 0x18;
      lVar21 = DAT_00120398;
      uVar11 = DAT_00120394;
      for (uVar23 = 0; uVar23 < *(uint *)(lVar21 + (ulong)uVar11 * 4); uVar23 = uVar23 + 1) {
        lVar19 = (ulong)(DAT_00120390 * uVar11) * 0x58 + DAT_001203a0;
        if (*(int *)(lVar20 + -0x18 + lVar19) == 2) {
          (**(code **)(lVar19 + -0x10 + lVar20))
                    (*(undefined8 *)(lVar19 + -8 + lVar20),*(undefined8 *)(lVar19 + lVar20),
                     *(undefined8 *)(lVar19 + 8 + lVar20),*(undefined4 *)(lVar19 + 0x10 + lVar20));
          lVar21 = DAT_00120398;
          uVar11 = DAT_00120394;
        }
        lVar20 = lVar20 + 0x58;
      }
      *(undefined4 *)(lVar21 + (ulong)uVar11 * 4) = 0;
      DAT_00120394 = ((DAT_00120394 + local_64) - bsc_s_bsc) % DAT_0012038c;
      uVar14 = (ulong)local_60;
      uVar23 = local_48;
      uVar11 = local_64;
      bVar17 = local_5c;
    }
    if (uVar11 == 0xffffffff) {
      if (DAT_001203a8 == 0) {
        DAT_00120394 = 0;
        bsc_s_bsc = 0;
        return 0;
      }
      __assert_fail("sbsc->total_n_outstanding_requests == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                    ,0x267,"bsc_step_t bsc_sync(bsc_step_t)");
    }
  } while( true );
}

Assistant:

bsc_step_t bsc_sync( bsc_step_t until )
{
    state_t * const sbsc = bsc();
    unsigned i, P = bsp_nprocs(), sz=sizeof(sbsc->next_step[0]);
    if ( !sbsc->next_step) {
        /* do some initialization */
        sbsc->next_step = calloc( bsp_nprocs(), sizeof(sbsc->next_step[0]));
        bsp_push_reg( sbsc->next_step, 
                bsp_nprocs() * sizeof(sbsc->next_step[0]) );
        bsp_sync();
    }

    while ( sbsc->current < until || until == bsc_flush ) {
        bsc_step_t common_step = until;
        for ( i = 0; i < P; ++i ) 
            sbsc->next_step[i] = bsc_flush;

        if (sbsc->horizon > 0) {
            /* expand all collectives */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                 request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                 if ( r->kind == COLL ) {
                     expand_coll( & r->payload.coll );
                 }
            }
            /* and insert them in small pieces into the queue */
            schedule_colls();

            /* execute the delayed puts and gets */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                 request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                 if ( r->kind == PUT ) {
                    assert( r->payload.put.src_pid == bsp_pid() ) ;
                    bsp_put( r->payload.put.dst_pid, 
                            r->payload.put.src_addr, r->payload.put.dst_addr, 
                            r->payload.put.offset, r->payload.put.size );
                 } else if ( r->kind == GET ) {
                    assert( r->payload.get.dst_pid == bsp_pid() ) ;
                    bsp_get( r->payload.get.src_pid, r->payload.get.src_addr,
                            r->payload.get.offset, r->payload.get.dst_addr, 
                            r->payload.get.size );
                 }
            }
            sbsc->total_n_outstanding_requests 
                -= sbsc->n_requests[ sbsc->queue_start ];

            /* search for the step this process can skip to */
            if ( 0 == sbsc->total_n_outstanding_requests ) {
                common_step = until;
            } else {
                for (common_step = 1; common_step < sbsc->horizon ; common_step++){
                    unsigned j = (sbsc->queue_start + common_step) % sbsc->horizon;
                    if ( sbsc->n_requests[j]  != 0 ) {
                        break;
                    }
                } 
                common_step += sbsc->current;
            }
        }

        if ( common_step != bsc_flush ) {
            for ( i = 0; i < P; ++i ) 
                bsp_put( i, &common_step, sbsc->next_step, bsp_pid()*sz, sz );
        }
        bsp_sync();
        common_step = until;
        for ( i = 0; i < P; ++i ) {
            if ( sbsc->next_step[i] < common_step )
                common_step = sbsc->next_step[i];
        }

        if (sbsc->horizon > 0) {
            /* execute the delayed local reduce operations */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                if ( r->kind == EXEC ) {
                    bsc_reduce_t f = r->payload.exec.func;
                    void * a = r->payload.exec.a;
                    const void * a0 = r->payload.exec.a0 ;
                    const void * xs = r->payload.exec.xs;
                    bsc_size_t size = r->payload.exec.size;
                    (*f)( a, a0, xs, size );
                }
            }
            sbsc->n_requests[ sbsc->queue_start ] = 0;
            sbsc->queue_start = (sbsc->queue_start+common_step-sbsc->current) % sbsc->horizon;
        }
        if ( common_step == bsc_flush ) {
            assert( sbsc->total_n_outstanding_requests == 0 );
            sbsc->current = 0;
            sbsc->queue_start = 0;
            break;
        }
        sbsc->current = common_step ;
    }

    return sbsc->current;
}